

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<1UL>::SetConfigurable
          (SimpleTypeHandler<1UL> *this,DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  bool bVar1;
  BOOL BVar2;
  DynamicTypeHandler *pDVar3;
  uint32 local_3c;
  ScriptContext *pSStack_38;
  uint32 indexVal;
  ScriptContext *scriptContext;
  uint local_28;
  uint uStack_24;
  PropertyIndex index;
  BOOL value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  SimpleTypeHandler<1UL> *this_local;
  
  local_28 = value;
  uStack_24 = propertyId;
  _value_local = instance;
  instance_local = (DynamicObject *)this;
  BVar2 = GetDescriptor(this,propertyId,(PropertyIndex *)((long)&scriptContext + 6));
  if (BVar2 == 0) {
    pSStack_38 = RecyclableObject::GetScriptContext(&_value_local->super_RecyclableObject);
    bVar1 = DynamicObject::HasObjectArray(_value_local);
    if ((bVar1) &&
       (BVar2 = ScriptContext::IsNumericPropertyId(pSStack_38,uStack_24,&local_3c), BVar2 != 0)) {
      pDVar3 = ConvertToTypeWithItemAttributes(this,_value_local);
      this_local._4_4_ =
           (*pDVar3->_vptr_DynamicTypeHandler[0x2b])
                     (pDVar3,_value_local,(ulong)uStack_24,(ulong)local_28);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    if (local_28 == 0) {
      ClearAttribute(this,_value_local,scriptContext._6_2_,'\x02');
    }
    else {
      SetAttribute(this,_value_local,scriptContext._6_2_,'\x02');
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL SimpleTypeHandler<size>::SetConfigurable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        PropertyIndex index;
        if (!GetDescriptor(propertyId, &index))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            ScriptContext* scriptContext = instance->GetScriptContext();
            uint32 indexVal;
            if (instance->HasObjectArray() && scriptContext->IsNumericPropertyId(propertyId, &indexVal))
            {
                return SimpleTypeHandler<size>::ConvertToTypeWithItemAttributes(instance)
                    ->SetConfigurable(instance, propertyId, value);
            }
            return true;
        }

        if (value)
        {
            SetAttribute(instance, index, PropertyConfigurable);
        }
        else
        {
            ClearAttribute(instance, index, PropertyConfigurable);
        }
        return true;
    }